

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeBodyBushingPlastic::ChLoadXYZROTnodeBodyBushingPlastic
          (ChLoadXYZROTnodeBodyBushingPlastic *this,shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeA
          ,shared_ptr<chrono::ChBody> *mbodyB,ChFrame<double> *abs_application,
          ChVector<double> *mstiffness,ChVector<double> *mdamping,ChVector<double> *myield)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             &mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadXYZROTnodeBodyBushingSpherical::ChLoadXYZROTnodeBodyBushingSpherical
            (&this->super_ChLoadXYZROTnodeBodyBushingSpherical,
             (shared_ptr<chrono::fea::ChNodeFEAxyzrot> *)&local_50,
             (shared_ptr<chrono::ChBody> *)&local_40,abs_application,mstiffness,mdamping);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  (this->super_ChLoadXYZROTnodeBodyBushingSpherical).super_ChLoadXYZROTnodeBody.
  super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZROTnodeBody_011773f8;
  (this->yield).m_data[0] = myield->m_data[0];
  (this->yield).m_data[1] = myield->m_data[1];
  auVar1 = vpermpd_avx2(ZEXT1632(_VNULL),0xd0);
  auVar1 = vblendps_avx(auVar1,ZEXT832((ulong)myield->m_data[2]),3);
  auVar2._8_8_ = DAT_011dd3e8;
  auVar2._0_8_ = DAT_011dd3e8;
  auVar2._16_8_ = DAT_011dd3e8;
  auVar2._24_8_ = DAT_011dd3e8;
  auVar1 = vblendps_avx(auVar1,auVar2,0xc0);
  *(undefined1 (*) [32])((this->yield).m_data + 2) = auVar1;
  return;
}

Assistant:

ChLoadXYZROTnodeBodyBushingPlastic::ChLoadXYZROTnodeBodyBushingPlastic(std::shared_ptr<ChNodeFEAxyzrot> mnodeA,
                                                                       std::shared_ptr<ChBody> mbodyB,
                                                                       const ChFrame<>& abs_application,
                                                                       const ChVector<>& mstiffness,
                                                                       const ChVector<>& mdamping,
                                                                       const ChVector<>& myield)
    : ChLoadXYZROTnodeBodyBushingSpherical(mnodeA, mbodyB, abs_application, mstiffness, mdamping),
      yield(myield),
      plastic_def(VNULL) {}